

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tunnel.c
# Opt level: O1

void on_write_complete(h2o_socket_t *sock,char *err)

{
  uint64_t *puVar1;
  h2o_http2_conn_t *conn;
  h2o_buffer_t *buffer;
  st_h2o_linklist_t *psVar2;
  st_h2o_linklist_t *psVar3;
  int iVar4;
  
  conn = (h2o_http2_conn_t *)sock->data;
  buffer = (conn->_write).buf_in_flight;
  if (buffer == (h2o_buffer_t *)0x0) {
    __assert_fail("conn->_write.buf_in_flight != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/http2/connection.c"
                  ,0x3d0,"void on_write_complete(h2o_socket_t *, const char *)");
  }
  if (err != (char *)0x0) {
    puVar1 = &(((conn->super).ctx)->http2).events.write_closed;
    *puVar1 = *puVar1 + 1;
    close_connection_now(conn);
    return;
  }
  (conn->_write).buf_in_flight = (h2o_buffer_t *)0x0;
  if (buffer->bytes != (char *)0x0) {
    h2o_buffer__do_free(buffer);
  }
  if ((conn->_write).buf_in_flight != (h2o_buffer_t *)0x0) {
    __assert_fail("conn->_write.buf_in_flight == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/http2/connection.c"
                  ,0x3db,"void on_write_complete(h2o_socket_t *, const char *)");
  }
  if (conn->state < H2O_HTTP2_CONN_STATE_IS_CLOSING) {
    while (psVar2 = (conn->_write).streams_to_proceed.next,
          psVar2 != &(conn->_write).streams_to_proceed) {
      if (psVar2[-3].next != (st_h2o_linklist_t *)0x0) {
        __assert_fail("!h2o_http2_stream_has_pending_data(stream)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/http2/connection.c"
                      ,0x3e2,"void on_write_complete(h2o_socket_t *, const char *)");
      }
      psVar3 = psVar2->next;
      psVar3->prev = psVar2->prev;
      psVar2->prev->next = psVar3;
      psVar2->next = (st_h2o_linklist_t *)0x0;
      psVar2->prev = (st_h2o_linklist_t *)0x0;
      h2o_http2_stream_proceed(conn,(h2o_http2_stream_t *)&psVar2[-10].prev);
    }
  }
  if ((conn->_write).timeout_entry._link.next != (st_h2o_linklist_t *)0x0) {
    h2o_timeout_unlink(&(conn->_write).timeout_entry);
  }
  if (conn->state != H2O_HTTP2_CONN_STATE_OPEN) {
    do_emit_writereq(conn);
    return;
  }
  if (((conn->_write).buf)->size == 0) {
    iVar4 = h2o_http2_scheduler_is_active(&conn->scheduler);
    if (iVar4 == 0) {
      return;
    }
  }
  h2o_socket_notify_write(sock,on_notify_write);
  return;
}

Assistant:

static void on_write_complete(h2o_socket_t *sock, const char *err)
{
    struct st_h2o_tunnel_t *tunnel = sock->data;
    h2o_socket_t *peer;
    assert(tunnel != NULL);
    assert(tunnel->sock[0] == sock || tunnel->sock[1] == sock);

    if (err != NULL) {
        close_connection(tunnel);
        return;
    }

    reset_timeout(tunnel);

    if (tunnel->sock[0] == sock)
        peer = tunnel->sock[1];
    else
        peer = tunnel->sock[0];

    h2o_buffer_consume(&peer->input, peer->input->size);
    h2o_socket_read_start(peer, on_read);
}